

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
::freeData(Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
           *this)

{
  code *pcVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  if (*(long *)(this + 0x80) != 0) {
    lVar4 = 0;
    do {
      uVar2 = (ulong)(byte)this[lVar4];
      if (uVar2 != 0xff) {
        pcVar1 = *(code **)(*(long *)(this + 0x80) + 0x18 + uVar2 * 0x28);
        if (pcVar1 != (code *)0x0) {
          lVar3 = *(long *)(this + 0x80) + uVar2 * 0x28 + 8;
          (*pcVar1)(lVar3,lVar3,3);
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x80);
    if (*(void **)(this + 0x80) != (void *)0x0) {
      operator_delete__(*(void **)(this + 0x80));
    }
    *(undefined8 *)(this + 0x80) = 0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }